

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_mipmapped_texture.cpp
# Opt level: O2

bool __thiscall
crnlib::mip_level::pack_to_dxt
          (mip_level *this,image_u8 *img,pixel_format fmt,bool cook,pack_params *orig_params,
          orientation_flags_t orient_flags)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  dxt_format dVar4;
  dxt_image *this_00;
  image_u8 tmp_img;
  pack_params p;
  image<crnlib::color_quad<unsigned_char,_int>_> iStack_98;
  undefined8 local_68;
  undefined8 uStack_60;
  ulong local_58;
  progress_callback_func p_Stack_50;
  void *local_48;
  undefined8 uStack_40;
  task_pool *local_38;
  
  iVar3 = pixel_format_helpers::is_dxt(fmt);
  if (iVar3 == 0) {
    cVar2 = '\0';
  }
  else {
    local_38 = orig_params->m_pTask_pool;
    local_68._0_4_ = orig_params->m_dxt1a_alpha_threshold;
    local_68._4_4_ = orig_params->m_num_helper_threads;
    uStack_60._0_4_ = orig_params->m_quality;
    uStack_60._4_4_ = orig_params->m_compressor;
    local_58._0_1_ = orig_params->m_perceptual;
    local_58._1_1_ = orig_params->m_dithering;
    local_58._2_1_ = orig_params->m_grayscale_sampling;
    local_58._3_1_ = orig_params->m_use_both_block_types;
    local_58._4_1_ = orig_params->m_endpoint_caching;
    local_58._5_1_ = orig_params->m_use_transparent_indices_for_black;
    local_58._6_2_ = *(undefined2 *)&orig_params->field_0x16;
    p_Stack_50 = orig_params->m_pProgress_callback;
    local_48 = orig_params->m_pProgress_callback_user_data_ptr;
    uStack_40._0_4_ = orig_params->m_progress_start;
    uStack_40._4_4_ = orig_params->m_progress_range;
    bVar1 = pixel_format_helpers::is_pixel_format_non_srgb(fmt);
    if ((bVar1) || ((img->m_comp_flags & 0x60) != 0)) {
      local_58 = local_58 & 0xffffffffffffff00;
    }
    image<crnlib::color_quad<unsigned_char,_int>_>::image(&iStack_98,img);
    clear(this);
    this->m_format = fmt;
    if (cook) {
      cook_image(this,&iStack_98);
    }
    if (((fmt == PIXEL_FMT_A8) || (fmt == PIXEL_FMT_DXT5A)) &&
       (((byte)iStack_98.m_comp_flags & 8) == 0)) {
      image<crnlib::color_quad<unsigned_char,_int>_>::set_alpha_to_luma(&iStack_98);
    }
    dVar4 = pixel_format_helpers::get_dxt_format(fmt);
    this_00 = crnlib_new<crnlib::dxt_image>();
    iVar3 = dxt_image::init(this_00,(EVP_PKEY_CTX *)(ulong)(uint)dVar4);
    cVar2 = (char)iVar3;
    if (cVar2 == '\0') {
      clear(this);
    }
    else {
      assign(this,this_00,fmt,orient_flags);
    }
    vector<crnlib::color_quad<unsigned_char,_int>_>::~vector(&iStack_98.m_pixel_buf);
  }
  return (bool)cVar2;
}

Assistant:

bool mip_level::pack_to_dxt(const image_u8& img, pixel_format fmt, bool cook, const dxt_image::pack_params& orig_params, orientation_flags_t orient_flags) {
  CRNLIB_ASSERT(pixel_format_helpers::is_dxt(fmt));
  if (!pixel_format_helpers::is_dxt(fmt))
    return false;

  dxt_image::pack_params p(orig_params);
  if (pixel_format_helpers::is_pixel_format_non_srgb(fmt) || (img.get_comp_flags() & pixel_format_helpers::cCompFlagNormalMap) || (img.get_comp_flags() & pixel_format_helpers::cCompFlagLumaChroma)) {
    // Disable perceptual colorspace metrics when packing to swizzled or non-RGB pixel formats.
    p.m_perceptual = false;
  }

  image_u8 tmp_img(img);

  clear();

  m_format = fmt;

  if (cook)
    cook_image(tmp_img);

  if ((pixel_format_helpers::is_alpha_only(fmt)) && (!tmp_img.has_alpha()))
    tmp_img.set_alpha_to_luma();

  dxt_format dxt_fmt = pixel_format_helpers::get_dxt_format(fmt);

  dxt_image* pDXT_image = crnlib_new<dxt_image>();
  if (!pDXT_image->init(dxt_fmt, tmp_img, p)) {
    clear();
    return false;
  }

  assign(pDXT_image, fmt, orient_flags);

  return true;
}